

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O0

void __thiscall
JsonTest::TestResult::addFailureInfo
          (TestResult *this,char *file,uint line,char *expr,uint nestingLevel)

{
  char *in_RCX;
  value_type *in_RDI;
  undefined4 in_R8D;
  Failure failure;
  Failure *in_stack_ffffffffffffff70;
  string local_70 [64];
  undefined4 local_30;
  undefined4 local_24;
  char *local_20;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  Failure::Failure(in_stack_ffffffffffffff70);
  if (local_20 != (char *)0x0) {
    std::__cxx11::string::operator=(local_70,local_20);
  }
  local_30 = local_24;
  std::deque<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>::push_back
            ((deque<JsonTest::Failure,_std::allocator<JsonTest::Failure>_> *)
             in_stack_ffffffffffffff70,in_RDI);
  Failure::~Failure(in_stack_ffffffffffffff70);
  return;
}

Assistant:

void TestResult::addFailureInfo(const char* file,
                                unsigned int line,
                                const char* expr,
                                unsigned int nestingLevel) {
  Failure failure;
  failure.file_ = file;
  failure.line_ = line;
  if (expr) {
    failure.expr_ = expr;
  }
  failure.nestingLevel_ = nestingLevel;
  failures_.push_back(failure);
}